

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
emplace_back<slang::ast::ValueSymbol*,slang::ast::Symbol_const*&>
          (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *this,
          ValueSymbol **args,Symbol **args_1)

{
  iterator this_00;
  Symbol **in_RDX;
  ValueSymbol **in_RSI;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_RDI;
  Symbol **in_stack_00000028;
  ValueSymbol **in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_stack_00000040;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::ValueSymbol*,slang::ast::Symbol_const*&>
                        (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  else {
    this_00 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::end
                        (in_RDI);
    std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>::
    pair<slang::ast::ValueSymbol_*,_const_slang::ast::Symbol_*&,_true>(this_00,in_RSI,in_RDX);
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::back
                        (in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }